

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aio.c
# Opt level: O2

int mraa_aio_read(mraa_aio_context dev)

{
  _func_int_mraa_aio_context *UNRECOVERED_JUMPTABLE;
  int iVar1;
  mraa_result_t mVar2;
  ssize_t sVar3;
  int *piVar4;
  ulong uVar5;
  char *__fmt;
  char *end;
  char buffer [17];
  
  if (dev == (mraa_aio_context)0x0) {
    __fmt = "aio: read: context is invalid";
  }
  else {
    if ((dev->advance_func != (mraa_adv_func_t *)0x0) &&
       (UNRECOVERED_JUMPTABLE = dev->advance_func->aio_read_replace,
       UNRECOVERED_JUMPTABLE != (_func_int_mraa_aio_context *)0x0)) {
      iVar1 = (*UNRECOVERED_JUMPTABLE)(dev);
      return iVar1;
    }
    iVar1 = dev->adc_in_fp;
    if (iVar1 == -1) {
      mVar2 = aio_get_valid_fp(dev);
      if (mVar2 != MRAA_SUCCESS) {
        __fmt = "aio: Failed to get to the device";
        goto LAB_0010ed66;
      }
      iVar1 = dev->adc_in_fp;
    }
    lseek(iVar1,0,0);
    sVar3 = read(dev->adc_in_fp,buffer,0x11);
    if (sVar3 < 1) {
      syslog(3,"aio: Failed to read a sensible value");
    }
    buffer[0x10] = '\0';
    lseek(dev->adc_in_fp,0,0);
    piVar4 = __errno_location();
    *piVar4 = 0;
    uVar5 = strtoul(buffer,&end,10);
    if (end == buffer) {
      __fmt = "aio: Value is not a decimal number";
    }
    else {
      if (*piVar4 == 0) {
        if (dev->value_bit <= raw_bits) {
          return (uint)uVar5 >> ((byte)shifter_value & 0x1f);
        }
        return (uint)uVar5 << ((byte)shifter_value & 0x1f);
      }
      __fmt = "aio: Errno was set";
    }
  }
LAB_0010ed66:
  syslog(3,__fmt);
  return -1;
}

Assistant:

int
mraa_aio_read(mraa_aio_context dev)
{
    if (dev == NULL) {
        syslog(LOG_ERR, "aio: read: context is invalid");
        return -1;
    }

    if (IS_FUNC_DEFINED(dev, aio_read_replace)) {
        return dev->advance_func->aio_read_replace(dev);
    }

    char buffer[17];
    if (dev->adc_in_fp == -1) {
        if (aio_get_valid_fp(dev) != MRAA_SUCCESS) {
            syslog(LOG_ERR, "aio: Failed to get to the device");
            return -1;
        }
    }

    lseek(dev->adc_in_fp, 0, SEEK_SET);
    if (read(dev->adc_in_fp, buffer, sizeof(buffer)) < 1) {
        syslog(LOG_ERR, "aio: Failed to read a sensible value");
    }
    // force NULL termination of string
    buffer[16] = '\0';
    lseek(dev->adc_in_fp, 0, SEEK_SET);

    errno = 0;
    char* end;
    unsigned int analog_value = (unsigned int) strtoul(buffer, &end, 10);
    if (end == &buffer[0]) {
        syslog(LOG_ERR, "aio: Value is not a decimal number");
        return -1;
    } else if (errno != 0) {
        syslog(LOG_ERR, "aio: Errno was set");
        return -1;
    }

    /* Adjust the raw analog input reading to supported resolution value*/
    if (raw_bits < dev->value_bit) {
        analog_value = analog_value << shifter_value;
    } else {
        analog_value = analog_value >> shifter_value;
    }

    return analog_value;
}